

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O2

void __thiscall cppurses::Painter::Painter(Painter *this,Widget *widg)

{
  Widget *pWVar1;
  size_t sVar2;
  _Map_base<cppurses::Widget_*,_std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>,_std::allocator<std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Widget_*>,_std::hash<cppurses::Widget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar3;
  bool bVar4;
  Widget *local_18;
  
  this->widget_ = widg;
  sVar2 = Widget::width(widg);
  (this->inner_area_).width = sVar2;
  sVar2 = Widget::height(this->widget_);
  (this->inner_area_).height = sVar2;
  pWVar1 = this->widget_;
  bVar4 = false;
  if ((pWVar1->enabled_ == true) && (bVar4 = false, pWVar1->outer_width_ != 0)) {
    bVar4 = pWVar1->outer_height_ != 0;
  }
  this->is_paintable_ = bVar4;
  this_00 = (_Map_base<cppurses::Widget_*,_std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>,_std::allocator<std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Widget_*>,_std::hash<cppurses::Widget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)detail::Staged_changes::get();
  local_18 = widg;
  pmVar3 = std::__detail::
           _Map_base<cppurses::Widget_*,_std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>,_std::allocator<std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Widget_*>,_std::hash<cppurses::Widget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_18);
  this->staged_changes_ = pmVar3;
  return;
}

Assistant:

Painter::Painter(Widget& widg)
    : widget_{widg},
      inner_area_{widget_.width(), widget_.height()},
      is_paintable_{detail::is_paintable(widget_)},
      staged_changes_{detail::Staged_changes::get()[&widg]}
{}